

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

double duckdb::Cast::Operation<short,double>(short input)

{
  bool bVar1;
  InvalidInputException *this;
  short in_DI;
  double result;
  short in_stack_000001ae;
  string local_30 [32];
  double local_10 [2];
  
  bVar1 = duckdb::TryCast::Operation<short,double>(in_DI,local_10,false);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<short,double>(in_stack_000001ae);
    duckdb::InvalidInputException::InvalidInputException(this,local_30);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_10[0];
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}